

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# car-cdr.c
# Opt level: O3

ConsCell * find_close_prior_cell(conspage *page,LispPTR oldcell)

{
  uint uVar1;
  uint uVar2;
  ConsCell *pCVar3;
  ConsCell *pCVar4;
  uint uVar5;
  uint uVar6;
  
  pCVar3 = (ConsCell *)0x0;
  uVar2 = *(uint *)&page->field_0x8 >> 0x10 & 0xff;
  if (uVar2 != 0) {
    uVar1 = oldcell & 0xff;
    if (uVar2 < uVar1 - 0xe || uVar1 <= uVar2) {
      do {
        uVar5 = *(uint *)((long)&page->cell6 + (ulong)uVar2 * 2);
        if (uVar5 < 0x1000000) {
          return (ConsCell *)0x0;
        }
        uVar5 = uVar5 >> 0x18;
        pCVar3 = (ConsCell *)(ulong)uVar2;
        uVar2 = uVar5;
      } while (uVar5 < uVar1 - 0xe || uVar1 <= uVar5);
    }
    do {
      uVar6 = uVar2;
      pCVar4 = pCVar3;
      uVar5 = *(uint *)((long)&page->cell6 + (ulong)uVar6 * 2);
      uVar2 = uVar5 >> 0x18;
      if (uVar2 <= uVar6) break;
      pCVar3 = (ConsCell *)(ulong)uVar6;
    } while (uVar2 < uVar1);
    if ((int)pCVar4 == 0) {
      uVar2 = *(uint *)&page->field_0x8 & 0xff00ffff | uVar5 >> 8 & 0xff0000;
    }
    else {
      *(char *)((long)&page->cell6 + (long)pCVar4 * 2 + 3) = (char)(uVar5 >> 0x18);
      uVar2 = *(uint *)&page->field_0x8;
    }
    pCVar3 = (ConsCell *)((long)&page->cell6 + (ulong)uVar6 * 2);
    *(uint *)&page->field_0x8 = uVar2 - 0x1000000;
    uVar2 = oldcell - uVar6 & 0xe;
    *pCVar3 = (ConsCell)(uVar2 * 0x8000000 + ((uint)*pCVar3 & 0xfffffff) + 0x80000000);
    if (0xfe < uVar2 + uVar6) {
      error("in fcpc, page overflow.");
    }
  }
  return pCVar3;
}

Assistant:

ConsCell *find_close_prior_cell(struct conspage *page, LispPTR oldcell) {
  unsigned oldoffset = oldcell & 0xFF;
  unsigned offset = page->next_cell;
  unsigned prior = 0;
  unsigned noffset;
  ConsCell *cell;

  while (offset) {
    if ((offset < oldoffset) && (offset >= (oldoffset - 14))) {
      noffset = FREECONS(page, offset)->next_free;
      while ((noffset > offset) && (noffset < oldoffset)) {
        prior = offset;
        offset = noffset;
        noffset = FREECONS(page, offset)->next_free;
      }
      cell = (ConsCell *)((DLword *)page + offset);
      if (prior)
        FREECONS(page, prior)->next_free = FREECONS(page, offset)->next_free;
      else
        page->next_cell = FREECONS(page, offset)->next_free;
      page->count -= 1;
      cell->cdr_code = CDR_ONPAGE | ((oldoffset - offset) >> 1);
      if (254 < (offset + ((cell->cdr_code & 7) << 1))) error("in fcpc, page overflow.");
      return (cell);
    }

    prior = offset;
    offset = ((freecons *)((DLword *)page + offset))->next_free;
  }
  return ((ConsCell *)0); /* No cell close enough */
}